

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge.hpp
# Opt level: O3

void __thiscall
optimization::mergeBlocks::Merge_Block::optimize_func(Merge_Block *this,MirFunction *func)

{
  _Rb_tree_header *p_Var1;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  _Base_ptr *__k;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar2;
  int *piVar3;
  uint32_t uVar4;
  _Base_ptr p_Var5;
  JumpKind JVar6;
  _Self __tmp_1;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  size_type sVar11;
  mapped_type *pmVar12;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var13;
  JumpInstructionKind JVar14;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  pVar16;
  
  p_Var1 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    return;
  }
  this_00 = &func->basic_blks;
  do {
    while ((100000 < *(int *)&p_Var10[1]._M_left || (*(long *)(p_Var10 + 3) != 1))) {
LAB_0012755d:
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      if ((_Rb_tree_header *)p_Var10 == p_Var1) {
        return;
      }
    }
    pmVar7 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at(this_00,(key_type *)(p_Var10[2]._M_left + 1));
    JVar14 = *(JumpInstructionKind *)&p_Var10[4]._M_parent;
    if (JVar14 == Return) {
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var1->_M_header);
      lVar9 = std::_Rb_tree_decrement(p_Var8);
      if (pmVar7->id != *(int *)(lVar9 + 0x20)) goto LAB_0012755d;
    }
    if (((pmVar7->jump).kind != Br) ||
       (__k = &p_Var10[1]._M_left, (pmVar7->jump).bb_true != *(int *)__k)) goto LAB_0012755d;
    p_Var13 = p_Var10[3]._M_parent;
    p_Var5 = p_Var10[3]._M_left;
    if (p_Var13 != p_Var5) {
      do {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&pmVar7->inst,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)p_Var13);
        p_Var13 = (_Base_ptr)&p_Var13->_M_parent;
      } while (p_Var13 != p_Var5);
      JVar14 = *(JumpInstructionKind *)&p_Var10[4]._M_parent;
    }
    p_Var13 = p_Var10[5]._M_parent;
    if ((char)p_Var10[5]._M_color == _S_black) {
      uVar4 = *(uint32_t *)&p_Var10[4]._M_right;
      JVar6 = *(JumpKind *)&p_Var10[5]._M_left;
      (pmVar7->jump).kind = JVar14;
      if ((pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
          .super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
        (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
        _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar4;
        (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
      }
      else {
        (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar4;
      }
    }
    else {
      JVar6 = *(JumpKind *)&p_Var10[5]._M_left;
      (pmVar7->jump).kind = JVar14;
      if ((pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
          .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) {
        (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
      }
    }
    piVar3 = &(pmVar7->jump).bb_true;
    *(_Base_ptr *)&(pmVar7->jump).bb_true = p_Var13;
    (pmVar7->jump).jump_kind = JVar6;
    sVar11 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::count(this_00,piVar3);
    if (sVar11 != 0) {
      pmVar12 = std::
                map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                ::at(this_00,piVar3);
      psVar2 = &pmVar12->preceding;
      pVar15 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range(&psVar2->_M_t,(key_type *)__k);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&psVar2->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)psVar2,
                 &pmVar7->id);
    }
    piVar3 = &(pmVar7->jump).bb_false;
    sVar11 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::count(this_00,piVar3);
    if (sVar11 != 0) {
      pmVar12 = std::
                map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                ::at(this_00,piVar3);
      psVar2 = &pmVar12->preceding;
      pVar15 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range(&psVar2->_M_t,(key_type *)__k);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&psVar2->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)psVar2,
                 &pmVar7->id);
    }
    pVar16 = std::
             _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::equal_range(&this_00->_M_t,(key_type *)__k);
    std::
    _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar16.first._M_node,(_Base_ptr)pVar16.second._M_node);
    p_Var10 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var10 == p_Var1) {
      return;
    }
  } while( true );
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    while (true) {
      bool flag = false;
      for (auto& blkiter : func.basic_blks) {
        auto& blk = blkiter.second;
        if (blk.id > 100000) {
          continue;
        }
        if (blk.preceding.size() == 1) {
          auto& preBlk = func.basic_blks.at(*blk.preceding.begin());
          auto end_iter = func.basic_blks.end();
          end_iter--;
          end_iter--;
          if (blk.jump.kind == mir::inst::JumpInstructionKind::Return &&
              preBlk.id !=
                  end_iter->first) {  // in this case, merge will cause the
                                      // end block's id is not the largest
            continue;
          }

          if (preBlk.jump.kind == mir::inst::JumpInstructionKind::Br &&
              preBlk.jump.bb_true == blk.id) {
            for (auto& inst : blk.inst) {
              preBlk.inst.push_back(std::move(inst));
            }
            preBlk.jump = mir::inst::JumpInstruction(
                blk.jump.kind, blk.jump.bb_true, blk.jump.bb_false,
                blk.jump.cond_or_ret, blk.jump.jump_kind);
            if (func.basic_blks.count(preBlk.jump.bb_true)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_true);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            if (func.basic_blks.count(preBlk.jump.bb_false)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_false);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            flag = true;
            func.basic_blks.erase(blk.id);
            break;
          }
        }
      }
      if (!flag) {
        break;
      }
    }
  }